

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O0

int testVisionFeatureScenePrintBasic(void)

{
  bool bVar1;
  ImageFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  FeatureDescription *this_04;
  VisionFeaturePrint_Scene *this_05;
  ostream *poVar2;
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  Result local_e8;
  VisionFeaturePrint *preprocessing;
  undefined1 local_b0 [48];
  Model model;
  FeatureDescription *output;
  FeatureDescription *input;
  ModelDescription *description;
  FeatureType *outputFeatureType;
  ArrayFeatureType *outputArrayFeatureType;
  FeatureType *inputFeatureType;
  ImageFeatureType *inputImageFeatureType;
  
  this = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_imagetype(this_00,this);
  this_01 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_01);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_02,this_01);
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  this_04 = CoreML::Specification::ModelDescription::add_input(this_03);
  model._40_8_ = CoreML::Specification::ModelDescription::add_output(this_03);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_04,this_00);
  CoreML::Specification::FeatureDescription::set_allocated_type
            ((FeatureDescription *)model._40_8_,this_02);
  CoreML::Specification::Model::Model((Model *)(local_b0 + 0x28));
  CoreML::Specification::Model::set_allocated_description((Model *)(local_b0 + 0x28),this_03);
  CoreML::validate<(MLModelType)2002>((Result_conflict1 *)local_b0,(Model *)(local_b0 + 0x28));
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x29);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((result).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    inputImageFeatureType._4_4_ = 1;
  }
  else {
    local_e8.m_message._M_storage._M_storage =
         (uchar  [8])
         CoreML::Specification::Model::mutable_visionfeatureprint((Model *)(local_b0 + 0x28));
    CoreML::validate<(MLModelType)2002>
              ((Result_conflict1 *)(local_110 + 0x28),(Model *)(local_b0 + 0x28));
    CoreML::Result::operator=((Result *)local_b0,(Result *)(local_110 + 0x28));
    CoreML::Result::~Result((Result *)(local_110 + 0x28));
    bVar1 = CoreML::Result::good((Result *)local_b0);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2d);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"!((result).good())");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      inputImageFeatureType._4_4_ = 1;
    }
    else {
      CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene
                ((VisionFeaturePrint *)local_e8.m_message._M_storage._M_storage);
      CoreML::validate<(MLModelType)2002>((Result_conflict1 *)local_110,(Model *)(local_b0 + 0x28));
      CoreML::Result::operator=((Result *)local_b0,(Result *)local_110);
      CoreML::Result::~Result((Result *)local_110);
      bVar1 = CoreML::Result::good((Result *)local_b0);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x31);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"!((result).good())");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        inputImageFeatureType._4_4_ = 1;
      }
      else {
        this_05 = CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene
                            ((VisionFeaturePrint *)local_e8.m_message._M_storage._M_storage);
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::set_version
                  (this_05,VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
        CoreML::validate<(MLModelType)2002>
                  ((Result_conflict1 *)local_138,(Model *)(local_b0 + 0x28));
        CoreML::Result::operator=((Result *)local_b0,(Result *)local_138);
        CoreML::Result::~Result((Result *)local_138);
        bVar1 = CoreML::Result::good((Result *)local_b0);
        if (bVar1) {
          inputImageFeatureType._4_4_ = 0;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(result).good()");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          inputImageFeatureType._4_4_ = 1;
        }
      }
    }
  }
  preprocessing._4_4_ = 1;
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)(local_b0 + 0x28));
  return inputImageFeatureType._4_4_;
}

Assistant:

int testVisionFeatureScenePrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}